

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall
UniformFunction::UniformFunction
          (UniformFunction *this,string *_type,function<void_(vera::Shader_&)> *_assign,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *_print)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *_print_local;
  function<void_(vera::Shader_&)> *_assign_local;
  string *_type_local;
  UniformFunction *this_local;
  
  std::function<void_(vera::Shader_&)>::function(&this->assign);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&this->print);
  std::__cxx11::string::string((string *)&this->type);
  this->present = false;
  std::__cxx11::string::operator=((string *)&this->type,(string *)_type);
  std::function<void_(vera::Shader_&)>::operator=(&this->assign,_assign);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&this->print,_print);
  return;
}

Assistant:

UniformFunction::UniformFunction(const std::string &_type, std::function<void(vera::Shader&)> _assign, std::function<std::string()> _print) {
    type = _type;
    assign = _assign;
    print = _print;
}